

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerateutils.cpp
# Opt level: O0

cppgenerate * __thiscall cppgenerate::uppercase(cppgenerate *this,string *input)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator it;
  string *input_local;
  string *newString;
  
  it._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  while( true ) {
    _Stack_38._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    uppercaseChar(*pcVar2);
    std::__cxx11::string::push_back((char)this);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28,0);
  }
  return this;
}

Assistant:

std::string cppgenerate::uppercase( std::string input ){
    std::string newString;
    std::string::const_iterator it = input.begin();

    while( it != input.end() ){
        char c = *it;
        newString.push_back( uppercaseChar( c ) );
        it++;
    }

    return newString;
}